

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImStb::stb_textedit_replace
               (ImGuiInputTextState *str,STB_TexteditState *state,ImWchar *text,int text_len)

{
  int insert_len;
  bool bVar1;
  ImWchar *pIVar2;
  long lVar3;
  
  insert_len = str->CurLenW;
  pIVar2 = stb_text_createundo(&state->undostate,0,insert_len,text_len);
  if (pIVar2 != (ImWchar *)0x0 && 0 < (long)insert_len) {
    lVar3 = 0;
    do {
      pIVar2[lVar3] = (str->TextW).Data[lVar3];
      lVar3 = lVar3 + 1;
    } while (insert_len != lVar3);
  }
  STB_TEXTEDIT_DELETECHARS(str,0,str->CurLenW);
  state->select_end = 0;
  state->cursor = 0;
  state->select_start = 0;
  if (0 < text_len) {
    bVar1 = STB_TEXTEDIT_INSERTCHARS(str,0,text,text_len);
    if (bVar1) {
      state->select_end = text_len;
      state->select_start = text_len;
      state->cursor = text_len;
      state->has_preferred_x = '\0';
    }
  }
  return;
}

Assistant:

static void stb_textedit_replace(ImGuiInputTextState* str, STB_TexteditState* state, const STB_TEXTEDIT_CHARTYPE* text, int text_len)
{
    stb_text_makeundo_replace(str, state, 0, str->CurLenW, text_len);
    ImStb::STB_TEXTEDIT_DELETECHARS(str, 0, str->CurLenW);
    state->cursor = state->select_start = state->select_end = 0;
    if (text_len <= 0)
        return;
    if (ImStb::STB_TEXTEDIT_INSERTCHARS(str, 0, text, text_len))
    {
        state->cursor = state->select_start = state->select_end = text_len;
        state->has_preferred_x = 0;
        return;
    }
    IM_ASSERT(0); // Failed to insert character, normally shouldn't happen because of how we currently use stb_textedit_replace()
}